

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptFunction::GetDiagValueString
          (JavascriptFunction *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  byte bVar1;
  Type TVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  LPCUTF8 this_00;
  bool bVar5;
  int propertyId;
  charcount_t cVar6;
  uint extraout_var;
  undefined4 *puVar7;
  FunctionProxy *this_01;
  ParseableFunctionInfo *this_02;
  LPCUTF8 puVar8;
  int *piVar9;
  size_t sVar10;
  PropertyString *name;
  JavascriptString *this_03;
  char16 *pcVar11;
  Type TVar12;
  Type countNeeded;
  charcount_t local_44;
  LPCUTF8 puStack_40;
  charcount_t displayNameLength;
  LPCUTF8 pbStart;
  RecyclableObject *obj;
  
  propertyId = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])();
  obj = (RecyclableObject *)CONCAT44(extraout_var,propertyId);
  if (obj == (RecyclableObject *)0x0) {
    this_01 = GetFunctionProxy(this);
    if (this_01 == (FunctionProxy *)0x0) {
      this_03 = StringCache::GetFunctionDisplay
                          (&((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->stringCache);
    }
    else {
      this_02 = FunctionProxy::EnsureDeserialized(this_01);
      bVar1 = ((this_02->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
      if ((bVar1 & 4) == 0) {
        countNeeded = this_02->m_cchLength;
        pbStart = (LPCUTF8)stringBuilder;
        puVar8 = ParseableFunctionInfo::GetToStringSource
                           (this_02,L"JavascriptFunction::GetDiagValueString");
        TVar2 = this_02->m_cbLength;
        puStack_40 = puVar8;
        piVar9 = (int *)FunctionProxy::GetAuxPtr(&this_02->super_FunctionProxy,PrintOffsets);
        this_00 = pbStart;
        TVar12 = TVar2;
        if (piVar9 != (int *)0x0) {
          TVar12 = piVar9[1] - *piVar9;
          countNeeded = countNeeded + (TVar12 - TVar2) * 3;
        }
        StringBuilder<Memory::ArenaAllocator>::EnsureBuffer
                  ((StringBuilder<Memory::ArenaAllocator> *)pbStart,countNeeded);
        sVar10 = utf8::DecodeUnitsInto
                           (*(char16 **)(this_00 + 0x20),&stack0xffffffffffffffc0,puVar8 + TVar12,
                            bVar1 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
        if (0x7ffffffd < sVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                      ,0xc61,"(decodedCount < MaxCharCount)",
                                      "decodedCount < MaxCharCount");
          if (!bVar5) goto LAB_00bc9c84;
          *puVar7 = 0;
        }
        cVar6 = 0x100;
        if ((uint)sVar10 < 0x100) {
          cVar6 = (uint)sVar10;
        }
        StringBuilder<Memory::ArenaAllocator>::IncreaseCount
                  ((StringBuilder<Memory::ArenaAllocator> *)this_00,cVar6);
        return 1;
      }
      local_44 = 0;
      pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      pcVar11 = FunctionProxy::GetShortDisplayName(&this_02->super_FunctionProxy,&local_44);
      this_03 = GetLibraryCodeDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                          (pSVar3,pcVar11);
    }
  }
  else {
    if ((extraout_var & 0x1ffff) == 0x10000 || (extraout_var & 0xffff0000) != 0x10000) {
      if ((extraout_var & 0xffff0000) != 0x10000) {
        if (((RecyclableObject *)0xffffffffffff < obj) ||
           (bVar5 = VarIsImpl<Js::JavascriptString>(obj), !bVar5)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                      ,0xc73,"(VarIs<JavascriptString>(sourceString))",
                                      "VarIs<JavascriptString>(sourceString)");
          if (!bVar5) goto LAB_00bc9c84;
          *puVar7 = 0;
        }
        this_03 = VarTo<Js::JavascriptString>(obj);
        goto LAB_00bc9bd7;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      pbStart = (LPCUTF8)stringBuilder;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00bc9c84;
      *puVar7 = 0;
      stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)pbStart;
    }
    pSVar3 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    if ((extraout_var & 0x1ffff) != 0x10000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00bc9c84;
      *puVar7 = 0;
    }
    name = ScriptContext::GetPropertyString(pSVar3,propertyId);
    this_03 = GetNativeFunctionDisplayStringCommon<Js::JavascriptString,Js::JavascriptString*,Js::ScriptContext>
                        (pSVar3,&name->super_JavascriptString);
  }
LAB_00bc9bd7:
  if (this_03 == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc78,"(pString)","pString");
    if (!bVar5) {
LAB_00bc9c84:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pcVar11 = JavascriptString::GetString(this_03);
  cVar6 = JavascriptString::GetLength(this_03);
  StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,cVar6);
  JavascriptString::CopyHelper(stringBuilder->appendPtr,pcVar11,cVar6);
  stringBuilder->appendPtr = stringBuilder->appendPtr + cVar6;
  stringBuilder->count = stringBuilder->count + cVar6;
  return 1;
}

Assistant:

BOOL JavascriptFunction::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        JavascriptString * pString = NULL;

        Var sourceString = this->GetSourceString();

        if (sourceString == nullptr)
        {
            FunctionProxy* proxy = this->GetFunctionProxy();
            if (proxy)
            {
                ParseableFunctionInfo * func = proxy->EnsureDeserialized();
                Utf8SourceInfo* sourceInfo = func->GetUtf8SourceInfo();
                if (sourceInfo->GetIsLibraryCode())
                {
                    charcount_t displayNameLength = 0;
                    pString = JavascriptFunction::GetLibraryCodeDisplayString(this->GetScriptContext(), func->GetShortDisplayName(&displayNameLength));
                }
                else
                {
                    utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
                    charcount_t count = func->LengthInChars();
                    LPCUTF8 pbStart = func->GetToStringSource(_u("JavascriptFunction::GetDiagValueString"));
                    size_t cbLength = func->LengthInBytes();
                    PrintOffsets* printOffsets = func->GetPrintOffsets();
                    if (printOffsets != nullptr)
                    {
                        count += 3*(charcount_t)((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength);
                        cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
                    }

                    size_t decodedCount = utf8::DecodeUnitsInto(stringBuilder->AllocBufferSpace(count), pbStart, pbStart + cbLength, options);
                    Assert(decodedCount < MaxCharCount);
                    stringBuilder->IncreaseCount(min(DIAG_MAX_FUNCTION_STRING, (charcount_t)decodedCount));
                    return TRUE;
                }
            }
            else
            {
                pString = GetLibrary()->GetFunctionDisplayString();
            }
        }
        else
        {
            if (TaggedInt::Is(sourceString))
            {
                pString = GetNativeFunctionDisplayString(this->GetScriptContext(), this->GetScriptContext()->GetPropertyString(TaggedInt::ToInt32(sourceString)));
            }
            else
            {
                Assert(VarIs<JavascriptString>(sourceString));
                pString = VarTo<JavascriptString>(sourceString);
            }
        }

        Assert(pString);
        stringBuilder->Append(pString->GetString(), pString->GetLength());

        return TRUE;
    }